

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_slay_name(parser *p)

{
  parser_error pVar1;
  char *pcVar2;
  void *pvVar3;
  
  pcVar2 = parser_getstr(p,"name");
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    string_free(*(char **)((long)pvVar3 + 8));
    pcVar2 = string_make(pcVar2);
    *(char **)((long)pvVar3 + 8) = pcVar2;
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_slay_name(struct parser *p) {
	const char *name = parser_getstr(p, "name");
	struct slay *slay = parser_priv(p);

	if (!slay) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	string_free(slay->name);
	slay->name = string_make(name);
	return PARSE_ERROR_NONE;
}